

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

bool __thiscall
winmd::reader::ElemSig::EnumValue::equals_enumerator(EnumValue *this,string_view *name)

{
  bool bVar1;
  Field FVar2;
  Constant CVar3;
  Constant local_80;
  constant_type local_70;
  anon_class_1_0_00000001 local_51;
  undefined1 local_50 [8];
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_build_O0_winmd_prefix_src_winmd_src_impl_winmd_reader_custom_attribute_h:49:50),_const_std::variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>_&>
  constant_value;
  undefined1 local_28 [8];
  Field field;
  string_view *name_local;
  EnumValue *this_local;
  
  field.super_row_base<winmd::reader::Field>._8_8_ = name;
  FVar2 = EnumDefinition::get_enumerator(&this->type,name);
  constant_value.
  super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  ._16_8_ = FVar2.super_row_base<winmd::reader::Field>.m_table;
  field.super_row_base<winmd::reader::Field>.m_table._0_4_ =
       FVar2.super_row_base<winmd::reader::Field>.m_index;
  local_28 = (undefined1  [8])
             constant_value.
             super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
             .
             super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             ._16_8_;
  std::
  visit<winmd::reader::ElemSig::EnumValue::equals_enumerator(std::basic_string_view<char,std::char_traits<char>>const&)const::_lambda(auto:1&&)_1_,std::variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>const&>
            ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_build_O0_winmd_prefix_src_winmd_src_impl_winmd_reader_custom_attribute_h:49:50),_const_std::variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>_&>
              *)local_50,&local_51,&this->value);
  CVar3 = Field::Constant((Field *)local_28);
  local_80.super_row_base<winmd::reader::Constant>.m_table =
       CVar3.super_row_base<winmd::reader::Constant>.m_table;
  local_80.super_row_base<winmd::reader::Constant>.m_index =
       CVar3.super_row_base<winmd::reader::Constant>.m_index;
  Constant::Value(&local_70,&local_80);
  bVar1 = std::operator==(&local_70,
                          (variant<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
                           *)local_50);
  return bVar1;
}

Assistant:

bool equals_enumerator(std::string_view const& name) const
            {
                auto field = type.get_enumerator(name);
                auto constant_value = std::visit([](auto&& v) { return Constant::constant_type{ v }; }, value);
                return field.Constant().Value() == constant_value;
            }